

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar_LibPrepare(int nSubgraphs)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  Dar_Lib_t *p;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  p = s_DarLib;
  if (s_DarLib->nSubgraphs == nSubgraphs) {
    return;
  }
  s_DarLib->nSubgr0Total = 0;
  lVar5 = 0;
  do {
    if (lVar5 == 1) {
      iVar6 = p->nSubgr[1];
      p->nSubgr0[1] = iVar6;
    }
    else {
      iVar6 = p->nSubgr[lVar5];
      if (nSubgraphs <= p->nSubgr[lVar5]) {
        iVar6 = nSubgraphs;
      }
      p->nSubgr0[lVar5] = iVar6;
    }
    p->nSubgr0Total = p->nSubgr0Total + iVar6;
    if (0 < p->nSubgr0[lVar5]) {
      piVar1 = p->pSubgr[lVar5];
      piVar2 = p->pPrios[lVar5];
      piVar3 = p->pSubgr0[lVar5];
      lVar7 = 0;
      do {
        piVar3[lVar7] = piVar1[piVar2[lVar7]];
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nSubgr0[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xde);
  piVar1 = p->nNodes0;
  iVar6 = 0;
  memset(piVar1,0,0x378);
  if (0 < p->iObj) {
    lVar5 = 0;
    do {
      p->pObjs[lVar5] = (Dar_LibObj_t)((ulong)p->pObjs[lVar5] & 0xfffffffff | 0xff000000000);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->iObj);
  }
  p->nNodes0Total = 0;
  p->nNodes0Max = 0;
  iVar4 = 0;
  lVar5 = 0;
  do {
    if (0 < p->nSubgr0[lVar5]) {
      lVar7 = 0;
      do {
        Dar_LibSetup0_rec(p,p->pObjs + p->pSubgr0[lVar5][lVar7],(int)lVar5,0);
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nSubgr0[lVar5]);
      iVar4 = p->nNodes0Total;
      iVar6 = p->nNodes0Max;
    }
    iVar4 = iVar4 + p->nNodes0[lVar5];
    p->nNodes0Total = iVar4;
    if (iVar6 <= p->nNodes0[lVar5]) {
      iVar6 = p->nNodes0[lVar5];
    }
    p->nNodes0Max = iVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xde);
  iVar6 = 0;
  memset(piVar1,0,0x378);
  if (0 < p->iObj) {
    lVar5 = 0;
    do {
      p->pObjs[lVar5] = (Dar_LibObj_t)((ulong)p->pObjs[lVar5] & 0xfffffffff | 0xff000000000);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->iObj);
  }
  lVar5 = 0;
  do {
    if (0 < p->nSubgr0[lVar5]) {
      lVar7 = 0;
      do {
        Dar_LibSetup0_rec(p,p->pObjs + p->pSubgr0[lVar5][lVar7],(int)lVar5,1);
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nSubgr0[lVar5]);
    }
    iVar6 = iVar6 + piVar1[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xde);
  if (iVar6 == p->nNodes0Total) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      p->pObjs[lVar7] = (Dar_LibObj_t)(((ulong)p->pObjs[lVar7] & 0xfffffffff) + lVar5);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x1000000000;
    } while (lVar7 != 4);
    Dar_LibCreateData(p,p->nNodes0Max + 0x20);
    return;
  }
  __assert_fail("nNodes0Total == p->nNodes0Total",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                ,0x21a,"void Dar_LibPrepare(int)");
}

Assistant:

void Dar_LibPrepare( int nSubgraphs )
{
    Dar_Lib_t * p = s_DarLib;
    int i, k, nNodes0Total;
    if ( p->nSubgraphs == nSubgraphs )
        return;

    // favor special classes:
    //  1 : F = (!d*!c*!b*!a)
    //  4 : F = (!d*!c*!(b*a))
    // 12 : F = (!d*!(c*!(!b*!a)))
    // 20 : F = (!d*!(c*b*a))

    // set the subgraph counters 
    p->nSubgr0Total = 0;
    for ( i = 0; i < 222; i++ )
    {
//        if ( i == 1 || i == 4 || i == 12 || i == 20 ) // special classes 
        if ( i == 1 ) // special classes 
            p->nSubgr0[i] = p->nSubgr[i];
        else
            p->nSubgr0[i] = Abc_MinInt( p->nSubgr[i], nSubgraphs );
        p->nSubgr0Total += p->nSubgr0[i];
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            p->pSubgr0[i][k] = p->pSubgr[i][ p->pPrios[i][k] ];
    }

    // count the number of nodes
    // clean node counters
    for ( i = 0; i < 222; i++ )
        p->nNodes0[i] = 0;
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // count nodes in each class
    // count the total number of nodes and the largest class
    p->nNodes0Total = 0;
    p->nNodes0Max = 0;
    for ( i = 0; i < 222; i++ )
    {
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            Dar_LibSetup0_rec( p, Dar_LibObj(p, p->pSubgr0[i][k]), i, 0 );
        p->nNodes0Total += p->nNodes0[i];
        p->nNodes0Max = Abc_MaxInt( p->nNodes0Max, p->nNodes0[i] );
    }

    // clean node counters
    for ( i = 0; i < 222; i++ )
        p->nNodes0[i] = 0;
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // add the nodes to storage
    nNodes0Total = 0;
    for ( i = 0; i < 222; i++ )
    {
        for ( k = 0; k < p->nSubgr0[i]; k++ )
            Dar_LibSetup0_rec( p, Dar_LibObj(p, p->pSubgr0[i][k]), i, 1 );
         nNodes0Total += p->nNodes0[i];
    }
    assert( nNodes0Total == p->nNodes0Total );
     // prepare the number of the PI nodes
    for ( i = 0; i < 4; i++ )
        Dar_LibObj(p, i)->Num = i;

    // realloc the datas
    Dar_LibCreateData( p, p->nNodes0Max + 32 ); 
    // allocated more because Dar_LibBuildBest() sometimes requires more entries
}